

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O1

bool __thiscall Dinic::levels(Dinic *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pvVar6;
  int *piVar7;
  pointer pEVar8;
  int *piVar9;
  undefined1 auStack_d8 [8];
  int b;
  _Elt_pointer local_c8;
  _Elt_pointer piStack_c0;
  _Elt_pointer local_b8;
  _Map_pointer ppiStack_b0;
  _Elt_pointer local_a8;
  _Elt_pointer piStack_a0;
  _Elt_pointer local_98;
  _Map_pointer ppiStack_90;
  undefined1 local_88 [8];
  queue<int,_std::deque<int,_std::allocator<int>_>_> bfs;
  
  piVar4 = (this->d).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar5 = (this->d).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar4 != piVar5) {
    memset(piVar4,0xff,((long)piVar5 + (-4 - (long)piVar4) & 0xfffffffffffffffcU) + 4);
  }
  piVar4[this->S] = 0;
  bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._4_4_ = this->S;
  auStack_d8 = (undefined1  [8])0x0;
  _b = 0;
  local_c8 = (_Elt_pointer)0x0;
  piStack_c0 = (_Elt_pointer)0x0;
  local_b8 = (_Elt_pointer)0x0;
  ppiStack_b0 = (_Map_pointer)0x0;
  local_a8 = (_Elt_pointer)0x0;
  piStack_a0 = (_Elt_pointer)0x0;
  local_98 = (_Elt_pointer)0x0;
  ppiStack_90 = (_Map_pointer)0x0;
  std::deque<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((deque<int,std::allocator<int>> *)auStack_d8,
             (undefined1 *)
             ((long)&bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 4));
  std::_Deque_base<int,_std::allocator<int>_>::_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)local_88,
             (_Deque_base<int,_std::allocator<int>_> *)auStack_d8);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)auStack_d8);
  do {
    if (bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
        _M_node ==
        (_Map_pointer)
        bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_map_size) break;
    iVar1 = *(int *)bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_map_size;
    if ((_Elt_pointer)
        bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_map_size ==
        bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
        _M_first + -1) {
      operator_delete(bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur);
      bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size
           = *(size_t *)
              (bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_start._M_last + 2);
      bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
      _M_first = (_Elt_pointer)
                 (bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                  _M_map_size + 0x200);
      bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
      _M_cur = (_Elt_pointer)
               bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_map_size;
      bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
      _M_last = bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_start._M_last + 2;
    }
    else {
      bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size
           = bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_map_size + 4;
    }
    iVar2 = this->T;
    if (iVar1 == iVar2) break;
    pvVar6 = (this->g).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar7 = *(pointer *)
              ((long)&pvVar6[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data + 8);
    for (piVar9 = pvVar6[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar9 != piVar7; piVar9 = piVar9 + 1) {
      pEVar8 = (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = pEVar8[*piVar9].b;
      auStack_d8._0_4_ = iVar3;
      piVar4 = (this->d).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((piVar4[iVar3] == -1) && (pEVar8 = pEVar8 + *piVar9, pEVar8->cap != pEVar8->flow)) {
        piVar4[iVar3] = piVar4[iVar1] + 1;
        if (bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_start._M_node ==
            (_Map_pointer)
            (bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_first + -1)) {
          std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                    ((deque<int,std::allocator<int>> *)local_88,(int *)auStack_d8);
        }
        else {
          *(int *)bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                  _M_start._M_node = iVar3;
          bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start
          ._M_node = (_Map_pointer)
                     ((long)bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node + 4);
        }
      }
    }
  } while (iVar1 != iVar2);
  iVar1 = (this->d).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[this->T];
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)local_88);
  return iVar1 != -1;
}

Assistant:

bool levels() {
        fill(d.begin(), d.end(), -1);
        d[S] = 0;
        queue<int> bfs({S});
        while (!bfs.empty()) {
            int a = bfs.front();
            bfs.pop();
            if (a == T) break;
            for (auto x : g[a]) {
                int b = e[x].b;
                if (d[b] != -1 || e[x].unused() == 0) continue;
                d[b] = d[a] + 1;
                bfs.push(b);
            }
        }
        return d[T] != -1;
    }